

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOICompactRewardDecPOMDPDiscrete.cpp
# Opt level: O2

double __thiscall
TOICompactRewardDecPOMDPDiscrete::GetReward
          (TOICompactRewardDecPOMDPDiscrete *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indSIs,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indAIs)

{
  RewardModel *pRVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  allocator_type local_69;
  double local_68;
  value_type_conflict2 local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nrElems;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indexVec;
  
  uVar3 = 0;
  local_68 = 0.0;
  while( true ) {
    uVar6 = (ulong)uVar3;
    uVar4 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                   super_TransitionObservationIndependentMADPDiscrete.
                                   super_MultiAgentDecisionProcess + 0x10))(this);
    if (uVar4 == uVar6) break;
    pRVar1 = (this->_m_p_rModels).super__Vector_base<RewardModel_*,_std::allocator<RewardModel_*>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar6];
    dVar7 = extraout_XMM0_Qa;
    (**(pRVar1->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface)
              (pRVar1,(ulong)(indSIs->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar6],
               (ulong)(indAIs->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar6]);
    uVar3 = uVar3 + 1;
    local_68 = local_68 + dVar7;
  }
  lVar5 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                 super_TransitionObservationIndependentMADPDiscrete.
                                 super_MultiAgentDecisionProcess + 0x10))(this);
  if (lVar5 == 2) {
    dVar7 = RewardModelTOISparse::Get((this->super_TOIDecPOMDPDiscrete)._m_p_rModel,indSIs,indAIs);
    local_68 = local_68 + dVar7;
  }
  else {
    nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&indexVec,2,(value_type_conflict1 *)&nrElems,(allocator_type *)&local_60);
    local_60 = (**(code **)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                      super_TransitionObservationIndependentMADPDiscrete.
                                      super_MultiAgentDecisionProcess + 0x10))(this);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&nrElems,2,&local_60,&local_69);
    do {
      if (*indexVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start !=
          indexVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[1]) {
        dVar7 = GetTwoAgentReward(this,*indexVec.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                  indexVec.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[1],indSIs,indAIs);
        local_68 = local_68 + dVar7;
      }
      bVar2 = IndexTools::Increment(&indexVec,&nrElems);
    } while (!bVar2);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&nrElems.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&indexVec.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  }
  return local_68;
}

Assistant:

double TOICompactRewardDecPOMDPDiscrete::GetReward(
    const std::vector<Index> &indSIs,
    const std::vector<Index> &indAIs) const
{
    double reward=0;

    for(unsigned int i=0;i!=GetNrAgents();++i)
        reward+=GetIndividualReward(indSIs[i],indAIs[i],i);

    switch(GetNrAgents())
    {
    case 2:
        reward+=_m_p_rModel->Get(indSIs,indAIs);
        break;
    default:
    {
        vector<Index> indexVec(2,0);
        vector<size_t> nrElems(2,GetNrAgents());

        do
        {
#if 0
            if(indexVec[0]!=indexVec[1] &&
               GetTwoAgentReward(indexVec[0],indexVec[1],indSIs,indAIs)!=0)
                cout << "adding  i " << indexVec[0]
                     << " si " << indSIs[indexVec[0]] 
                     << GetIndividualMADPD(indexVec[0])->GetState(indSIs[indexVec[0]])->SoftPrint()
                     << " j " << indexVec[1] 
                     << " sj " << indSIs[indexVec[1]]
                     << GetIndividualMADPD(indexVec[1])->GetState(indSIs[indexVec[1]])->SoftPrint()
                     << " r "
                     << GetTwoAgentReward(indexVec[0],indexVec[1],
                                          indSIs,indAIs) << endl;
#endif
            if(indexVec[0]!=indexVec[1])
                reward+=GetTwoAgentReward(indexVec[0],indexVec[1],
                                          indSIs,indAIs);
        }
        while(!IndexTools::Increment(indexVec,nrElems));

#if 0
        reward2+=GetTwoAgentReward(0,1,indSIs,indAIs);
        reward2+=GetTwoAgentReward(1,0,indSIs,indAIs);

        reward2+=GetTwoAgentReward(0,2,indSIs,indAIs);
        reward2+=GetTwoAgentReward(2,0,indSIs,indAIs);

        reward2+=GetTwoAgentReward(1,2,indSIs,indAIs);
        reward2+=GetTwoAgentReward(2,1,indSIs,indAIs);
#endif
        break;
    }
    }

#if DEBUG_TOICompactRewardDecPOMDPDiscrete
    cout << "GetReward(" << sI << "," << jaI << ") = " << reward << endl;
#endif
    return(reward);
}